

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

char * create_hostcache_id(char *name,int port)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)curl_maprintf("%s:%d",name,port);
  pbVar4 = pbVar3;
  if (pbVar3 != (byte *)0x0) {
    for (; (bVar1 = *pbVar4, bVar1 != 0 && (bVar1 != 0x3a)); pbVar4 = pbVar4 + 1) {
      iVar2 = tolower((uint)bVar1);
      *pbVar4 = (byte)iVar2;
    }
  }
  return (char *)pbVar3;
}

Assistant:

static char *
create_hostcache_id(const char *name, int port)
{
  /* create and return the new allocated entry */
  char *id = aprintf("%s:%d", name, port);
  char *ptr = id;
  if(ptr) {
    /* lower case the name part */
    while(*ptr && (*ptr != ':')) {
      *ptr = (char)TOLOWER(*ptr);
      ptr++;
    }
  }
  return id;
}